

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ChildWindowComparer(void *lhs,void *rhs)

{
  long lVar1;
  long lVar2;
  int d_1;
  int d;
  ImGuiWindow *b;
  ImGuiWindow *a;
  void *rhs_local;
  void *lhs_local;
  
  lVar1 = *lhs;
  lVar2 = *rhs;
  lhs_local._4_4_ = (*(uint *)(lVar1 + 0xc) & 0x4000000) - (*(uint *)(lVar2 + 0xc) & 0x4000000);
  if ((lhs_local._4_4_ == 0) &&
     (lhs_local._4_4_ = (*(uint *)(lVar1 + 0xc) & 0x2000000) - (*(uint *)(lVar2 + 0xc) & 0x2000000),
     lhs_local._4_4_ == 0)) {
    lhs_local._4_4_ = *(int *)(lVar1 + 0x84) - *(int *)(lVar2 + 0x84);
  }
  return lhs_local._4_4_;
}

Assistant:

static int IMGUI_CDECL ChildWindowComparer(const void* lhs, const void* rhs)
{
    const ImGuiWindow* const a = *(const ImGuiWindow* const *)lhs;
    const ImGuiWindow* const b = *(const ImGuiWindow* const *)rhs;
    if (int d = (a->Flags & ImGuiWindowFlags_Popup) - (b->Flags & ImGuiWindowFlags_Popup))
        return d;
    if (int d = (a->Flags & ImGuiWindowFlags_Tooltip) - (b->Flags & ImGuiWindowFlags_Tooltip))
        return d;
    return (a->BeginOrderWithinParent - b->BeginOrderWithinParent);
}